

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O0

void __thiscall MetaSim::Simulation::initSingleRun(Simulation *this)

{
  long in_RDI;
  Tick local_10 [2];
  
  Tick::Tick(local_10,0);
  *(impl_t *)(in_RDI + 0x70) = local_10[0].v;
  Entity::callNewRun();
  BaseStat::newRun();
  return;
}

Assistant:

void Simulation::initSingleRun()
    {
        globTime = 0;

        // Run Initialization:
        // Before each run, call the newRun() of every entity
        // and setup statistics
        Entity::callNewRun();

        BaseStat::newRun();
    }